

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * __thiscall
sfc::Image::crop(Image *__return_storage_ptr__,Image *this,uint x,uint y,uint crop_width,
                uint crop_height,Mode mode)

{
  undefined4 uVar1;
  size_type sVar2;
  uchar *puVar3;
  reference pvVar4;
  const_reference pvVar5;
  iterator __first;
  iterator __last;
  uint local_e0;
  uint local_dc;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_80 [8];
  rgba_vec_t rgba_v;
  uint local_60;
  uint iy_1;
  uint iy;
  uint blit_height;
  uint blit_width;
  size_t i;
  size_t fillsize;
  uint32_t fillval;
  uint crop_height_local;
  uint crop_width_local;
  uint y_local;
  uint x_local;
  Image *this_local;
  Image *img;
  
  Image(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->_palette,&this->_palette);
  __return_storage_ptr__->_width = crop_width;
  __return_storage_ptr__->_height = crop_height;
  __return_storage_ptr__->_src_coord_x = x;
  __return_storage_ptr__->_src_coord_y = y;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&__return_storage_ptr__->_data,(ulong)(crop_width * crop_height * 4));
  uVar1 = 0;
  if (mode == gb) {
    uVar1 = 0xff000000;
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&__return_storage_ptr__->_data);
  for (_blit_width = 0; _blit_width < sVar2; _blit_width = _blit_width + 4) {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&__return_storage_ptr__->_data);
    *(undefined4 *)(puVar3 + _blit_width) = uVar1;
  }
  if ((this->_width < x) || (this->_height < y)) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_indexed_data);
    if (sVar2 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&__return_storage_ptr__->_indexed_data,(ulong)(crop_width * crop_height));
    }
  }
  else {
    local_dc = crop_width;
    if (this->_width < x + crop_width) {
      local_dc = this->_width - x;
    }
    local_e0 = crop_height;
    if (this->_height < y + crop_height) {
      local_e0 = this->_height - y;
    }
    for (local_60 = 0; local_60 < local_e0; local_60 = local_60 + 1) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&__return_storage_ptr__->_data,
                          (ulong)(local_60 * __return_storage_ptr__->_width * 4));
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_data,(ulong)(x * 4 + (local_60 + y) * this->_width * 4));
      memcpy(pvVar4,pvVar5,(ulong)(local_dc << 2));
    }
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_indexed_data);
    if (sVar2 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&__return_storage_ptr__->_indexed_data,(ulong)(crop_width * crop_height));
      for (rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < local_e0;
          rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&__return_storage_ptr__->_indexed_data,
                            (ulong)(rgba_v.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                                   __return_storage_ptr__->_width));
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_indexed_data,
                            (ulong)(x + (rgba_v.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                        y) * this->_width));
        memcpy(pvVar4,pvVar5,(ulong)local_dc);
      }
    }
    rgba_data((rgba_vec_t *)local_80,__return_storage_ptr__);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_b0,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (&__return_storage_ptr__->_colors,&local_b0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::crop(unsigned x, unsigned y, unsigned crop_width, unsigned crop_height, Mode mode) const {
  Image img;
  img._palette = _palette;
  img._width = crop_width;
  img._height = crop_height;
  img._src_coord_x = x;
  img._src_coord_y = y;
  img._data.resize(crop_width * crop_height * 4);

  uint32_t fillval = mode == Mode::gb ? 0xff000000 : transparent_color;
  size_t fillsize = img._data.size();
  for (size_t i = 0; i < fillsize; i += 4)
    std::memcpy(img._data.data() + i, &fillval, sizeof(fillval));

  if (x > _width || y > _height) {
    // Crop outside source image: return empty
    if (_indexed_data.size())
      img._indexed_data.resize(crop_width * crop_height);
    return img;
  }

  unsigned blit_width = (x + crop_width > _width) ? _width - x : crop_width;
  unsigned blit_height = (y + crop_height > _height) ? _height - y : crop_height;

  for (unsigned iy = 0; iy < blit_height; ++iy) {
    std::memcpy(&img._data[iy * img._width * 4], &_data[(x * 4) + ((iy + y) * _width * 4)], blit_width * 4);
  }

  if (_indexed_data.size()) {
    img._indexed_data.resize(crop_width * crop_height);
    for (unsigned iy = 0; iy < blit_height; ++iy) {
      std::memcpy(&img._indexed_data[iy * img._width], &_indexed_data[x + ((iy + y) * _width)], blit_width);
    }
  }

  auto rgba_v = img.rgba_data();
  img._colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
  return img;
}